

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O0

void __thiscall
cmArchiveWrite::cmArchiveWrite(cmArchiveWrite *this,ostream *os,Compress c,string *format)

{
  int iVar1;
  archive *paVar2;
  char *name;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string *local_28;
  string *format_local;
  ostream *poStack_18;
  Compress c_local;
  ostream *os_local;
  cmArchiveWrite *this_local;
  
  this->Stream = os;
  local_28 = format;
  format_local._4_4_ = c;
  poStack_18 = os;
  os_local = (ostream *)this;
  paVar2 = archive_write_new();
  this->Archive = paVar2;
  paVar2 = archive_read_disk_new();
  this->Disk = paVar2;
  this->Verbose = false;
  std::__cxx11::string::string((string *)&this->Error);
  std::__cxx11::string::string((string *)&this->MTime);
  switch(format_local._4_4_) {
  case CompressNone:
    iVar1 = archive_write_set_compression_none(this->Archive);
    if (iVar1 != 0) {
      std::__cxx11::string::operator=((string *)&this->Error,"archive_write_set_compression_none: ")
      ;
      cm_archive_error_string_abi_cxx11_(&local_58,this->Archive);
      std::__cxx11::string::operator+=((string *)&this->Error,(string *)&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      return;
    }
    break;
  case CompressCompress:
    iVar1 = archive_write_set_compression_compress(this->Archive);
    if (iVar1 != 0) {
      std::__cxx11::string::operator=
                ((string *)&this->Error,"archive_write_set_compression_compress: ");
      cm_archive_error_string_abi_cxx11_(&local_78,this->Archive);
      std::__cxx11::string::operator+=((string *)&this->Error,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      return;
    }
    break;
  case CompressGZip:
    iVar1 = archive_write_set_compression_gzip(this->Archive);
    if (iVar1 != 0) {
      std::__cxx11::string::operator=((string *)&this->Error,"archive_write_set_compression_gzip: ")
      ;
      cm_archive_error_string_abi_cxx11_(&local_98,this->Archive);
      std::__cxx11::string::operator+=((string *)&this->Error,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      return;
    }
    break;
  case CompressBZip2:
    iVar1 = archive_write_set_compression_bzip2(this->Archive);
    if (iVar1 != 0) {
      std::__cxx11::string::operator=
                ((string *)&this->Error,"archive_write_set_compression_bzip2: ");
      cm_archive_error_string_abi_cxx11_(&local_b8,this->Archive);
      std::__cxx11::string::operator+=((string *)&this->Error,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      return;
    }
    break;
  case CompressLZMA:
    iVar1 = archive_write_set_compression_lzma(this->Archive);
    if (iVar1 != 0) {
      std::__cxx11::string::operator=((string *)&this->Error,"archive_write_set_compression_lzma: ")
      ;
      cm_archive_error_string_abi_cxx11_(&local_d8,this->Archive);
      std::__cxx11::string::operator+=((string *)&this->Error,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      return;
    }
    break;
  case CompressXZ:
    iVar1 = archive_write_set_compression_xz(this->Archive);
    if (iVar1 != 0) {
      std::__cxx11::string::operator=((string *)&this->Error,"archive_write_set_compression_xz: ");
      cm_archive_error_string_abi_cxx11_(&local_f8,this->Archive);
      std::__cxx11::string::operator+=((string *)&this->Error,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      return;
    }
  }
  iVar1 = archive_read_disk_set_standard_lookup(this->Disk);
  if (iVar1 == 0) {
    paVar2 = this->Archive;
    name = (char *)std::__cxx11::string::c_str();
    iVar1 = archive_write_set_format_by_name(paVar2,name);
    if (iVar1 == 0) {
      iVar1 = archive_write_set_bytes_in_last_block(this->Archive,1);
      if (iVar1 == 0) {
        iVar1 = archive_write_open(this->Archive,this,(undefined1 *)0x0,Callback::Write,
                                   (undefined1 *)0x0);
        if (iVar1 != 0) {
          std::__cxx11::string::operator=((string *)&this->Error,"archive_write_open: ");
          cm_archive_error_string_abi_cxx11_(&local_178,this->Archive);
          std::__cxx11::string::operator+=((string *)&this->Error,(string *)&local_178);
          std::__cxx11::string::~string((string *)&local_178);
        }
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)&this->Error,"archive_write_set_bytes_in_last_block: ");
        cm_archive_error_string_abi_cxx11_(&local_158,this->Archive);
        std::__cxx11::string::operator+=((string *)&this->Error,(string *)&local_158);
        std::__cxx11::string::~string((string *)&local_158);
      }
    }
    else {
      std::__cxx11::string::operator=((string *)&this->Error,"archive_write_set_format_by_name: ");
      cm_archive_error_string_abi_cxx11_(&local_138,this->Archive);
      std::__cxx11::string::operator+=((string *)&this->Error,(string *)&local_138);
      std::__cxx11::string::~string((string *)&local_138);
    }
  }
  else {
    std::__cxx11::string::operator=
              ((string *)&this->Error,"archive_read_disk_set_standard_lookup: ");
    cm_archive_error_string_abi_cxx11_(&local_118,this->Archive);
    std::__cxx11::string::operator+=((string *)&this->Error,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
  }
  return;
}

Assistant:

cmArchiveWrite::cmArchiveWrite(
  std::ostream& os, Compress c, std::string const& format):
    Stream(os),
    Archive(archive_write_new()),
    Disk(archive_read_disk_new()),
    Verbose(false)
{
  switch (c)
    {
    case CompressNone:
      if(archive_write_set_compression_none(this->Archive) != ARCHIVE_OK)
        {
        this->Error = "archive_write_set_compression_none: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
        }
      break;
    case CompressCompress:
      if(archive_write_set_compression_compress(this->Archive) != ARCHIVE_OK)
        {
        this->Error = "archive_write_set_compression_compress: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
        }
      break;
    case CompressGZip:
      if(archive_write_set_compression_gzip(this->Archive) != ARCHIVE_OK)
        {
        this->Error = "archive_write_set_compression_gzip: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
        }
      break;
    case CompressBZip2:
      if(archive_write_set_compression_bzip2(this->Archive) != ARCHIVE_OK)
        {
        this->Error = "archive_write_set_compression_bzip2: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
        }
      break;
    case CompressLZMA:
      if(archive_write_set_compression_lzma(this->Archive) != ARCHIVE_OK)
        {
        this->Error = "archive_write_set_compression_lzma: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
        }
      break;
    case CompressXZ:
      if(archive_write_set_compression_xz(this->Archive) != ARCHIVE_OK)
        {
        this->Error = "archive_write_set_compression_xz: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
        }
      break;
    };
#if !defined(_WIN32) || defined(__CYGWIN__)
  if (archive_read_disk_set_standard_lookup(this->Disk) != ARCHIVE_OK)
    {
    this->Error = "archive_read_disk_set_standard_lookup: ";
    this->Error += cm_archive_error_string(this->Archive);
    return;
    }
#endif

  if(archive_write_set_format_by_name(this->Archive, format.c_str())
    != ARCHIVE_OK)
    {
    this->Error = "archive_write_set_format_by_name: ";
    this->Error += cm_archive_error_string(this->Archive);
    return;
    }

  // do not pad the last block!!
  if (archive_write_set_bytes_in_last_block(this->Archive, 1))
    {
    this->Error = "archive_write_set_bytes_in_last_block: ";
    this->Error += cm_archive_error_string(this->Archive);
    return;
    }

  if(archive_write_open(
       this->Archive, this, 0,
       reinterpret_cast<archive_write_callback*>(&Callback::Write),
       0) != ARCHIVE_OK)
    {
    this->Error = "archive_write_open: ";
    this->Error += cm_archive_error_string(this->Archive);
    return;
    }
}